

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

double ON_InternalDefuzz(double rel_tol,double x)

{
  double __x;
  double local_58;
  double local_50;
  double y;
  double fa;
  double ia;
  double a;
  double s;
  double x_local;
  double rel_tol_local;
  
  x_local = rel_tol;
  if (rel_tol < 8.881784197001252e-16) {
    x_local = 8.881784197001252e-16;
  }
  __x = ABS(x) * 256.0;
  rel_tol_local = x;
  if (255.0 < __x) {
    fa = floor(__x);
    if (0.5 < __x - fa) {
      fa = fa + 1.0;
    }
    local_58 = x;
    if (ABS(__x - fa) <= __x * x_local) {
      if (0.0 <= x) {
        local_50 = fa;
      }
      else {
        local_50 = -fa;
      }
      local_58 = local_50 / 256.0;
    }
    rel_tol_local = local_58;
  }
  return rel_tol_local;
}

Assistant:

static double ON_InternalDefuzz( double rel_tol, double x)
{
  if (!(rel_tol >= 4.0*ON_EPSILON))
    rel_tol = 4.0*ON_EPSILON;
  const double s = 256.0;
  const double a = s*fabs(x);
  if (!(a > 255.0))
    return x;

  double ia = floor(a);
  double fa = a - ia;
  if (fa > 0.5)
    ia += 1.0;
  const double y
    = (fabs(a - ia) <= a*rel_tol)
    ? (((x < 0.0) ? -ia : ia)/s)
    : x;

  return y;
}